

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O2

void __thiscall r_exec::Pred::~Pred(Pred *this)

{
  ~Pred(this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT Pred:
    public LObject
{
public:
    Pred();
    Pred(r_code::SysObject *source);
    Pred(_Fact *target, double psln_thr);

    bool is_invalidated();
    bool grounds_invalidated(_Fact *evidence);

    _Fact *get_target() const;

    std::vector<P<_Fact> > grounds; // f1->obj; predictions that were used to build this predictions (i.e. antecedents); empty if simulated.
    std::vector<P<Sim> > simulations;

    bool is_simulation() const;
    Sim *get_simulation(Controller *root) const; // return true if there is a simulation for the goal.
}